

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::interval_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThanEquals,bool,false,false>
               (interval_t *ldata,interval_t *rdata,bool *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong local_78;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar17 = 8;
      iVar7 = 0;
      do {
        lVar15 = *(long *)((long)ldata + lVar17 + -8);
        lVar11 = *(long *)((long)&ldata->months + lVar17);
        lVar9 = *(long *)((long)rdata + lVar17 + -8);
        lVar10 = *(long *)((long)&rdata->months + lVar17);
        lVar12 = (lVar9 >> 0x20) + lVar10 / 86400000000;
        lVar13 = lVar12 % 0x1e;
        lVar9 = (long)(int)lVar9 + lVar12 / 0x1e;
        lVar12 = (lVar15 >> 0x20) + lVar11 / 86400000000;
        lVar16 = lVar12 % 0x1e;
        lVar15 = (long)(int)lVar15 + lVar12 / 0x1e;
        if (lVar15 < lVar9) {
          bVar3 = false;
        }
        else {
          bVar3 = true;
          if (lVar15 <= lVar9) {
            if (lVar16 < lVar13) {
              bVar3 = false;
            }
            else {
              bVar3 = lVar10 % 86400000000 <= lVar11 % 86400000000 || lVar13 < lVar16;
            }
          }
        }
        result_data[iVar7] = bVar3;
        iVar7 = iVar7 + 1;
        lVar17 = lVar17 + 0x10;
      } while (count != iVar7);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_78 = 0;
    uVar5 = 0;
    do {
      uVar14 = puVar1[uVar5];
      uVar4 = local_78 + 0x40;
      if (count <= local_78 + 0x40) {
        uVar4 = count;
      }
      uVar2 = uVar4;
      if (uVar14 != 0) {
        uVar2 = local_78;
        if (uVar14 == 0xffffffffffffffff) {
          if (local_78 < uVar4) {
            uVar14 = local_78 << 4 | 8;
            do {
              lVar17 = *(long *)((long)ldata + (uVar14 - 8));
              lVar15 = *(long *)((long)&ldata->months + uVar14);
              lVar11 = *(long *)((long)rdata + (uVar14 - 8));
              lVar9 = *(long *)((long)&rdata->months + uVar14);
              lVar10 = (lVar11 >> 0x20) + lVar9 / 86400000000;
              lVar12 = lVar10 % 0x1e;
              lVar16 = (long)(int)lVar11 + lVar10 / 0x1e;
              lVar11 = (lVar17 >> 0x20) + lVar15 / 86400000000;
              lVar10 = lVar11 % 0x1e;
              lVar17 = (long)(int)lVar17 + lVar11 / 0x1e;
              if (lVar17 < lVar16) {
LAB_00355d3f:
                bVar3 = false;
              }
              else {
                bVar3 = true;
                if (lVar17 <= lVar16) {
                  if (lVar10 < lVar12) goto LAB_00355d3f;
                  bVar3 = lVar9 % 86400000000 <= lVar15 % 86400000000 || lVar12 < lVar10;
                }
              }
              result_data[local_78] = bVar3;
              local_78 = local_78 + 1;
              uVar14 = uVar14 + 0x10;
              uVar2 = uVar4;
            } while (uVar4 != local_78);
          }
        }
        else if (local_78 < uVar4) {
          uVar6 = local_78 << 4 | 8;
          uVar8 = 0;
          do {
            if ((uVar14 >> (uVar8 & 0x3f) & 1) != 0) {
              lVar17 = *(long *)((long)ldata + (uVar6 - 8));
              lVar15 = *(long *)((long)&ldata->months + uVar6);
              lVar11 = *(long *)((long)rdata + (uVar6 - 8));
              lVar9 = *(long *)((long)&rdata->months + uVar6);
              lVar10 = (lVar11 >> 0x20) + lVar9 / 86400000000;
              lVar12 = lVar10 % 0x1e;
              lVar16 = (long)(int)lVar11 + lVar10 / 0x1e;
              lVar11 = (lVar17 >> 0x20) + lVar15 / 86400000000;
              lVar10 = lVar11 % 0x1e;
              lVar17 = (long)(int)lVar17 + lVar11 / 0x1e;
              if (lVar17 < lVar16) {
LAB_00355e8d:
                bVar3 = false;
              }
              else {
                bVar3 = true;
                if (lVar17 <= lVar16) {
                  if (lVar10 < lVar12) goto LAB_00355e8d;
                  bVar3 = lVar9 % 86400000000 <= lVar15 % 86400000000 || lVar12 < lVar10;
                }
              }
              result_data[uVar8 + local_78] = bVar3;
            }
            uVar8 = uVar8 + 1;
            uVar6 = uVar6 + 0x10;
            uVar2 = uVar4;
          } while (uVar4 - local_78 != uVar8);
        }
      }
      local_78 = uVar2;
      uVar5 = uVar5 + 1;
    } while (uVar5 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}